

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_ManFindBoolCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVolume,
                      Vec_Ptr_t *vLeaves)

{
  int iVar1;
  int iVar2;
  int local_78;
  int local_70;
  uint local_6c;
  int k;
  int Lev;
  int LevelLimit;
  int RetValue;
  Ivy_Obj_t *pPivot;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *pFanin0;
  Ivy_Obj_t *pFaninC;
  Ivy_Obj_t *pObj;
  Vec_Ptr_t *vLeaves_local;
  Vec_Ptr_t *vVolume_local;
  Vec_Ptr_t *vFront_local;
  Ivy_Obj_t *pRoot_local;
  Ivy_Man_t *p_local;
  
  pFaninC = (Ivy_Obj_t *)0x0;
  pObj = (Ivy_Obj_t *)vLeaves;
  vLeaves_local = vVolume;
  vVolume_local = vFront;
  vFront_local = (Vec_Ptr_t *)pRoot;
  pRoot_local = (Ivy_Obj_t *)p;
  iVar1 = Ivy_IsComplement(pRoot);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x135,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Vec_PtrClear(vVolume_local);
  Vec_PtrClear(vLeaves_local);
  iVar1 = Ivy_ObjIsMuxType((Ivy_Obj_t *)vFront_local);
  if (iVar1 == 0) {
    pFanin0 = (Ivy_Obj_t *)0x0;
    pFanin1 = Ivy_ObjFanin0((Ivy_Obj_t *)vFront_local);
    pPivot = Ivy_ObjFanin1((Ivy_Obj_t *)vFront_local);
  }
  else {
    pFanin0 = Ivy_ObjRecognizeMux((Ivy_Obj_t *)vFront_local,&pFanin1,&pPivot);
  }
  *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 & 0xffffffef | 0x10;
  Vec_PtrPush(vVolume_local,pFanin1);
  Vec_PtrPush(vLeaves_local,pFanin1);
  *(uint *)&pPivot->field_0x8 = *(uint *)&pPivot->field_0x8 & 0xffffffdf | 0x20;
  Vec_PtrPush(vVolume_local,pPivot);
  Vec_PtrPush(vLeaves_local,pPivot);
  iVar1 = Ivy_ObjLevel((Ivy_Obj_t *)vFront_local);
  iVar2 = Ivy_ObjLevelNew((Ivy_Obj_t *)vFront_local);
  if (iVar1 != iVar2) {
    __assert_fail("Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x14a,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  _LevelLimit = (Ivy_Obj_t *)0x0;
  iVar1 = Ivy_ObjLevel((Ivy_Obj_t *)vFront_local);
  if (iVar1 + -10 < 2) {
    local_78 = 1;
  }
  else {
    local_78 = Ivy_ObjLevel((Ivy_Obj_t *)vFront_local);
    local_78 = local_78 + -10;
  }
  local_6c = Ivy_ObjLevel((Ivy_Obj_t *)vFront_local);
  do {
    local_6c = local_6c - 1;
    if ((int)local_6c < local_78) break;
    do {
      while( true ) {
        local_70 = 0;
        while ((iVar1 = Vec_PtrSize(vVolume_local), local_70 < iVar1 &&
               (pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vVolume_local,local_70),
               *(uint *)&pFaninC->field_0x8 >> 0xb != local_6c))) {
          local_70 = local_70 + 1;
        }
        iVar1 = Vec_PtrSize(vVolume_local);
        if (local_70 == iVar1) goto LAB_00c0c9a8;
        if ((int)local_6c < (int)(*(uint *)&pFaninC->field_0x8 >> 0xb)) {
          __assert_fail("(int)pObj->Level <= Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                        ,0x157,
                        "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        if ((*(uint *)&pFaninC->field_0x8 >> 4 & 1) == (*(uint *)&pFaninC->field_0x8 >> 5 & 1)) {
          __assert_fail("pObj->fMarkA ^ pObj->fMarkB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                        ,0x158,
                        "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        Vec_PtrRemove(vVolume_local,pFaninC);
        pFanin1 = Ivy_ObjFanin0(pFaninC);
        if (((*(uint *)&pFanin1->field_0x8 >> 4 & 1) == 0) &&
           ((*(uint *)&pFanin1->field_0x8 >> 5 & 1) == 0)) {
          Vec_PtrPush(vVolume_local,pFanin1);
          Vec_PtrPush(vLeaves_local,pFanin1);
        }
        if ((*(uint *)&pFaninC->field_0x8 >> 4 & 1) != 0) {
          *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 & 0xffffffef | 0x10;
        }
        if ((*(uint *)&pFaninC->field_0x8 >> 5 & 1) != 0) {
          *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 & 0xffffffdf | 0x20;
        }
        iVar1 = Ivy_ObjIsBuf(pFaninC);
        if (iVar1 == 0) break;
        if (((*(uint *)&pFanin1->field_0x8 >> 4 & 1) != 0) &&
           ((*(uint *)&pFanin1->field_0x8 >> 5 & 1) != 0)) {
          _LevelLimit = pFanin1;
          goto LAB_00c0c9a8;
        }
      }
      pPivot = Ivy_ObjFanin1(pFaninC);
      if (((*(uint *)&pPivot->field_0x8 >> 4 & 1) == 0) &&
         ((*(uint *)&pPivot->field_0x8 >> 5 & 1) == 0)) {
        Vec_PtrPush(vVolume_local,pPivot);
        Vec_PtrPush(vLeaves_local,pPivot);
      }
      if ((*(uint *)&pFaninC->field_0x8 >> 4 & 1) != 0) {
        *(uint *)&pPivot->field_0x8 = *(uint *)&pPivot->field_0x8 & 0xffffffef | 0x10;
      }
      if ((*(uint *)&pFaninC->field_0x8 >> 5 & 1) != 0) {
        *(uint *)&pPivot->field_0x8 = *(uint *)&pPivot->field_0x8 & 0xffffffdf | 0x20;
      }
      if (((*(uint *)&pFanin1->field_0x8 >> 4 & 1) != 0) &&
         ((*(uint *)&pFanin1->field_0x8 >> 5 & 1) != 0)) {
        _LevelLimit = pFanin1;
        goto LAB_00c0c9a8;
      }
    } while (((*(uint *)&pPivot->field_0x8 >> 4 & 1) == 0) ||
            ((*(uint *)&pPivot->field_0x8 >> 5 & 1) == 0));
    _LevelLimit = pPivot;
LAB_00c0c9a8:
  } while (_LevelLimit == (Ivy_Obj_t *)0x0);
  if (_LevelLimit == (Ivy_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    if (((pFanin0 != (Ivy_Obj_t *)0x0) && ((*(uint *)&pFanin0->field_0x8 >> 4 & 1) == 0)) &&
       ((*(uint *)&pFanin0->field_0x8 >> 5 & 1) == 0)) {
      Vec_PtrPush(vVolume_local,pFanin0);
    }
    for (local_70 = 0; iVar1 = Vec_PtrSize(vLeaves_local), local_70 < iVar1; local_70 = local_70 + 1
        ) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vLeaves_local,local_70);
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffdf;
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffef;
    }
    for (local_70 = 0; iVar1 = Vec_PtrSize(vVolume_local), local_70 < iVar1; local_70 = local_70 + 1
        ) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vVolume_local,local_70);
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffef | 0x10;
    }
    Vec_PtrClear((Vec_Ptr_t *)pObj);
    Vec_PtrClear(vLeaves_local);
    iVar1 = Ivy_ManFindBoolCut_rec
                      ((Ivy_Man_t *)pRoot_local,(Ivy_Obj_t *)vFront_local,(Vec_Ptr_t *)pObj,
                       vLeaves_local,_LevelLimit);
    if (iVar1 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                    ,0x19f,
                    "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    for (local_70 = 0; iVar1 = Vec_PtrSize(vVolume_local), local_70 < iVar1; local_70 = local_70 + 1
        ) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vVolume_local,local_70);
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffef;
    }
    for (local_70 = 0; iVar1 = Vec_PtrSize(vLeaves_local), local_70 < iVar1; local_70 = local_70 + 1
        ) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vLeaves_local,local_70);
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffef | 0x10;
    }
LAB_00c0cc1a:
    for (local_70 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_70 < iVar1;
        local_70 = local_70 + 1) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_70);
      iVar1 = Ivy_ManFindBoolCutCost(pFaninC);
      if (iVar1 < 2) break;
    }
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj);
    if (local_70 != iVar1) {
      Vec_PtrRemove((Vec_Ptr_t *)pObj,pFaninC);
      pFanin1 = Ivy_ObjFanin0(pFaninC);
      if ((*(uint *)&pFanin1->field_0x8 >> 4 & 1) == 0) {
        *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 & 0xffffffef | 0x10;
        Vec_PtrPush(vLeaves_local,pFanin1);
        Vec_PtrPush((Vec_Ptr_t *)pObj,pFanin1);
      }
      iVar1 = Ivy_ObjIsBuf(pFaninC);
      if ((iVar1 == 0) &&
         (pPivot = Ivy_ObjFanin1(pFaninC), (*(uint *)&pPivot->field_0x8 >> 4 & 1) == 0)) {
        *(uint *)&pPivot->field_0x8 = *(uint *)&pPivot->field_0x8 & 0xffffffef | 0x10;
        Vec_PtrPush(vLeaves_local,pPivot);
        Vec_PtrPush((Vec_Ptr_t *)pObj,pPivot);
      }
      goto LAB_00c0cc1a;
    }
    for (local_70 = 0; iVar1 = Vec_PtrSize(vLeaves_local), local_70 < iVar1; local_70 = local_70 + 1
        ) {
      pFaninC = (Ivy_Obj_t *)Vec_PtrEntry(vLeaves_local,local_70);
      *(uint *)&pFaninC->field_0x8 = *(uint *)&pFaninC->field_0x8 & 0xffffffef;
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManFindBoolCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVolume, Vec_Ptr_t * vLeaves )
{
    Ivy_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pFaninC, * pFanin0, * pFanin1, * pPivot;
    int RetValue, LevelLimit, Lev, k;
    assert( !Ivy_IsComplement(pRoot) );
    // clear the frontier and collect the nodes
    Vec_PtrClear( vFront );
    Vec_PtrClear( vVolume );
    if ( Ivy_ObjIsMuxType(pRoot) )
        pFaninC = Ivy_ObjRecognizeMux( pRoot, &pFanin0, &pFanin1 );
    else
    {
        pFaninC = NULL;
        pFanin0 = Ivy_ObjFanin0(pRoot);
        pFanin1 = Ivy_ObjFanin1(pRoot); 
    }
    // start cone A
    pFanin0->fMarkA = 1;
    Vec_PtrPush( vFront, pFanin0 );
    Vec_PtrPush( vVolume, pFanin0 );
    // start cone B
    pFanin1->fMarkB = 1;
    Vec_PtrPush( vFront, pFanin1 );
    Vec_PtrPush( vVolume, pFanin1 );
    // iteratively expand until the common node (pPivot) is found or limit is reached
    assert( Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot) );
    pPivot = NULL;
    LevelLimit = IVY_MAX( Ivy_ObjLevel(pRoot) - 10, 1 );
    for ( Lev = Ivy_ObjLevel(pRoot) - 1; Lev >= LevelLimit; Lev-- )
    {
        while ( 1 )
        {
            // find the next node to expand on this level
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
                if ( (int)pObj->Level == Lev )
                    break;
            if ( k == Vec_PtrSize(vFront) )
                break;
            assert( (int)pObj->Level <= Lev );
            assert( pObj->fMarkA ^ pObj->fMarkB );
            // remove the old node
            Vec_PtrRemove( vFront, pObj );

            // expand this node
            pFanin0 = Ivy_ObjFanin0(pObj);
            if ( !pFanin0->fMarkA && !pFanin0->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin0 );
                Vec_PtrPush( vVolume, pFanin0 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin0->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin0->fMarkB = 1; 

            if ( Ivy_ObjIsBuf(pObj) )
            {
                if ( pFanin0->fMarkA && pFanin0->fMarkB )
                {
                    pPivot = pFanin0;
                    break;
                }
                continue;
            }

            // expand this node
            pFanin1 = Ivy_ObjFanin1(pObj); 
            if ( !pFanin1->fMarkA && !pFanin1->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin1 );
                Vec_PtrPush( vVolume, pFanin1 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin1->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin1->fMarkB = 1; 

            // consider if it is time to quit
            if ( pFanin0->fMarkA && pFanin0->fMarkB )
            {
                pPivot = pFanin0;
                break;
            }
            if ( pFanin1->fMarkA && pFanin1->fMarkB )
            {
                pPivot = pFanin1;
                break;
            }
        }
        if ( pPivot != NULL )
            break;
    }
    if ( pPivot == NULL )
        return 0;
    // if the MUX control is defined, it should not be
    if ( pFaninC && !pFaninC->fMarkA && !pFaninC->fMarkB )
        Vec_PtrPush( vFront, pFaninC );
    // clean the markings
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = pObj->fMarkB = 0;

    // mark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 1;
    // cut exists, collect all the nodes on the shortest path to the pivot
    Vec_PtrClear( vLeaves );
    Vec_PtrClear( vVolume );
    RetValue = Ivy_ManFindBoolCut_rec( p, pRoot, vLeaves, vVolume, pPivot );
    assert( RetValue == 1 );
    // unmark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 0;

    // mark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 1;
    // expand the cut without increasing its size
    while ( 1 )
    {
        Vec_PtrForEachEntry( Ivy_Obj_t *, vLeaves, pObj, k )
            if ( Ivy_ManFindBoolCutCost(pObj) < 2 )
                break;
        if ( k == Vec_PtrSize(vLeaves) )
            break;
        // the node can be expanded
        // remove the old node
        Vec_PtrRemove( vLeaves, pObj );
        // expand this node
        pFanin0 = Ivy_ObjFanin0(pObj);
        if ( !pFanin0->fMarkA )
        {
            pFanin0->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin0 );
            Vec_PtrPush( vLeaves, pFanin0 );
        }
        if ( Ivy_ObjIsBuf(pObj) )
            continue;
        // expand this node
        pFanin1 = Ivy_ObjFanin1(pObj);
        if ( !pFanin1->fMarkA )
        {
            pFanin1->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin1 );
            Vec_PtrPush( vLeaves, pFanin1 );
        }        
    }
    // unmark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 0;
    return 1;
}